

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall
imrt::Collimator::setActiveBeamlets
          (Collimator *this,
          map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
          *coord)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *this_00;
  reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  undefined8 in_RSI;
  key_type_conflict *in_RDI;
  int s_1;
  int s;
  int j;
  int i;
  pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  angle;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  *__range1;
  bool flag;
  int selmin;
  int selmax;
  double nmin;
  double nmax;
  vector<double,_std::allocator<double>_> aux;
  iterator it;
  pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  *in_stack_ffffffffffffff08;
  pair<int,_int> in_stack_ffffffffffffff10;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_a4;
  int local_a0;
  int local_9c;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> vStack_80;
  _Self local_68;
  _Self local_60;
  undefined8 local_58;
  byte local_49;
  int local_48;
  int local_44;
  double local_40;
  double local_38;
  _Rb_tree_iterator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>_>_>
  local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>_>_>
  ::_Rb_tree_iterator(&local_18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x126ffe);
  local_58 = local_10;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
       ::begin((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                *)in_stack_ffffffffffffff08);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
       ::end((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
              *)in_stack_ffffffffffffff08);
  while (bVar2 = std::operator!=(&local_60,&local_68), bVar2) {
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 *)0x127063);
    std::
    pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
    ::pair((pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
            *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    for (local_9c = 0;
        sVar3 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18)),
        (ulong)(long)local_9c < sVar3; local_9c = local_9c + 1) {
      local_49 = 0;
      local_38 = -9999999.0;
      local_40 = 9999999.0;
      local_a0 = 0;
      while( true ) {
        this_00 = std::
                  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                  ::operator[]((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_RDI);
        sVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(this_00);
        if (sVar3 <= (ulong)(long)local_a0) break;
        pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](&vStack_80,(long)local_a0);
        dVar1 = pvVar4->first;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                            (long)local_9c);
        if ((dVar1 == *pvVar5) && (!NAN(dVar1) && !NAN(*pvVar5))) {
          pvVar4 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](&vStack_80,(long)local_a0);
          if (pvVar4->second < local_40) {
            pvVar4 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[](&vStack_80,(long)local_a0);
            local_40 = pvVar4->second;
          }
          pvVar4 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](&vStack_80,(long)local_a0);
          if (local_38 < pvVar4->second) {
            pvVar4 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[](&vStack_80,(long)local_a0);
            local_38 = pvVar4->second;
          }
          local_49 = 1;
        }
        local_a0 = local_a0 + 1;
      }
      if ((local_49 & 1) == 0) {
        local_48 = -1;
        local_44 = -1;
      }
      else {
        local_a4 = 0;
        while( true ) {
          in_stack_ffffffffffffff20 = (vector<double,_std::allocator<double>_> *)(long)local_a4;
          pvVar6 = (vector<double,_std::allocator<double>_> *)
                   std::vector<double,_std::allocator<double>_>::size
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e));
          if (pvVar6 <= in_stack_ffffffffffffff20) break;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                              (long)local_a4);
          if ((*pvVar5 == local_40) && (!NAN(*pvVar5) && !NAN(local_40))) {
            local_48 = local_a4;
          }
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                              (long)local_a4);
          if ((*pvVar5 == local_38) && (!NAN(*pvVar5) && !NAN(local_38))) {
            local_44 = local_a4;
          }
          local_a4 = local_a4 + 1;
        }
      }
      std::
      map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::operator[]((map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_RDI);
      in_stack_ffffffffffffff10 =
           std::make_pair<int&,int&>(&in_stack_ffffffffffffff08->first,(int *)0x12732e);
      in_stack_ffffffffffffff54 = in_stack_ffffffffffffff10.first;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
    }
    std::
    pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
    ::~pair((pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
             *)0x12736c);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  *)in_stack_ffffffffffffff10);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void Collimator::setActiveBeamlets(map<int,  vector<pair<double,double> > >& coord){
    map<int, map<string, vector<double> > > ::iterator it;
    vector<double> aux;
    double nmax, nmin;
    int selmax, selmin;
    bool flag;

    for (auto angle : coord){
      int i=angle.first;
    //for (int i=0; i<nb_angles; i++) {
      // Angle cycle
      for (int j=0; j<xcoord.size(); j++) {
        flag=false;
        // Row cycle
        nmax=-9999999; nmin=9999999;
        for (int s=0; s<coord[i].size(); s++) {
          if (angle.second[s].first == xcoord[j]) {
            if (angle.second[s].second<nmin)
              nmin=angle.second[s].second;
            if (angle.second[s].second>nmax)
              nmax=angle.second[s].second;
            flag=true;
          }
        }

        if (flag) {
          for (int s=0; s<ycoord.size(); s++) {
            if (ycoord[s]==nmin) selmin=s;
            //NOTA DE LESLIE: Aqui habia un else que no era correcto!!
            if(ycoord[s]==nmax) selmax=s;
          }
        } else {
          selmin=-1;selmax=-1;
        }
        angle_row_beam_active[i].push_back(make_pair(selmin, selmax));
      }
    }
  }